

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sxmlc.c
# Opt level: O2

int fprintHTML(FILE *f,SXML_CHAR *str)

{
  char cVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  
  iVar4 = 0;
  do {
    cVar1 = *str;
    if (cVar1 == '\0') {
      return iVar4;
    }
    lVar2 = 0;
    do {
      lVar3 = lVar2;
      if (lVar3 + 0x18 == 0x90) {
        if (f != (FILE *)0x0) {
          fputc((int)cVar1,(FILE *)f);
        }
        iVar4 = iVar4 + 1;
        goto LAB_00105fe5;
      }
      lVar2 = lVar3 + 0x18;
    } while (cVar1 != (&HTML_SPECIAL_DICT[0].chr)[lVar3]);
    if (f != (FILE *)0x0) {
      fputs(*(char **)((long)&HTML_SPECIAL_DICT[0].html + lVar3),(FILE *)f);
    }
    iVar4 = iVar4 + *(int *)((long)&HTML_SPECIAL_DICT[0].html_len + lVar3);
LAB_00105fe5:
    str = str + 1;
  } while( true );
}

Assistant:

int fprintHTML(FILE* f, SXML_CHAR* str)
{
	SXML_CHAR* p;
	int i, n;
	
	for (p = str, n = 0; *p != NULC; p++) {
		for (i = 0; HTML_SPECIAL_DICT[i].chr; i++) {
			if (*p != HTML_SPECIAL_DICT[i].chr)
				continue;
			if (f != NULL)
				sx_fputs(HTML_SPECIAL_DICT[i].html, f);
			n += HTML_SPECIAL_DICT[i].html_len;
			break;
		}
		if (HTML_SPECIAL_DICT[i].chr == NULC) {
			if (f != NULL)
				(void)sx_fputc(*p, f);
			n++;
		}
	}
	
	return n;
}